

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDfs.c
# Opt level: O3

void Abc_NtkDfsReverseNodes_rec(Abc_Obj_t *pNode,Vec_Ptr_t *vNodes)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  Abc_Ntk_t *pAVar4;
  Abc_Ntk_t *pAVar5;
  uint uVar6;
  void **ppvVar7;
  ulong uVar8;
  int in_EDX;
  int Fill;
  uint uVar9;
  uint uVar10;
  long lVar11;
  
  if ((*(uint *)&pNode->field_0x14 & 0xf) == 6) {
    __assert_fail("!Abc_ObjIsNet(pNode)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcDfs.c"
                  ,0x105,"void Abc_NtkDfsReverseNodes_rec(Abc_Obj_t *, Vec_Ptr_t *)");
  }
  pAVar4 = pNode->pNtk;
  iVar2 = pNode->Id;
  Vec_IntFillExtra(&pAVar4->vTravIds,iVar2 + 1,in_EDX);
  if (((long)iVar2 < 0) || ((pAVar4->vTravIds).nSize <= iVar2)) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                  ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  pAVar5 = pNode->pNtk;
  iVar3 = pAVar5->nTravIds;
  if ((pAVar4->vTravIds).pArray[iVar2] == iVar3) {
    return;
  }
  iVar2 = pNode->Id;
  Vec_IntFillExtra(&pAVar5->vTravIds,iVar2 + 1,Fill);
  if (((long)iVar2 < 0) || ((pAVar5->vTravIds).nSize <= iVar2)) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                  ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
  }
  (pAVar5->vTravIds).pArray[iVar2] = iVar3;
  uVar6 = *(uint *)&pNode->field_0x14 & 0xf;
  if (0xfffffffd < uVar6 - 5) {
    return;
  }
  if (uVar6 != 7) {
    __assert_fail("Abc_ObjIsNode( pNode )",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcDfs.c"
                  ,0x10e,"void Abc_NtkDfsReverseNodes_rec(Abc_Obj_t *, Vec_Ptr_t *)");
  }
  if (pNode->pNtk->ntkType == ABC_NTK_NETLIST) {
    pNode = (Abc_Obj_t *)pNode->pNtk->vObjs->pArray[*(pNode->vFanouts).pArray];
  }
  if (0 < (pNode->vFanouts).nSize) {
    lVar11 = 0;
    do {
      Abc_NtkDfsReverseNodes_rec
                ((Abc_Obj_t *)pNode->pNtk->vObjs->pArray[(pNode->vFanouts).pArray[lVar11]],vNodes);
      lVar11 = lVar11 + 1;
    } while (lVar11 < (pNode->vFanouts).nSize);
  }
  uVar10 = *(uint *)&pNode->field_0x14 >> 0xc;
  uVar6 = vNodes->nSize;
  if ((int)uVar10 < (int)uVar6) goto LAB_008554d0;
  uVar1 = uVar10 + 1;
  iVar2 = vNodes->nCap;
  uVar9 = iVar2 * 2;
  if ((int)uVar10 < (int)uVar9) {
    if (iVar2 <= (int)uVar10) {
      if (vNodes->pArray == (void **)0x0) {
        ppvVar7 = (void **)malloc((ulong)uVar9 << 3);
      }
      else {
        ppvVar7 = (void **)realloc(vNodes->pArray,(ulong)uVar9 << 3);
      }
      vNodes->pArray = ppvVar7;
LAB_008554a1:
      vNodes->nCap = uVar9;
      uVar6 = vNodes->nSize;
    }
  }
  else if (iVar2 <= (int)uVar10) {
    if (vNodes->pArray == (void **)0x0) {
      ppvVar7 = (void **)malloc((ulong)(uVar1 * 8));
    }
    else {
      ppvVar7 = (void **)realloc(vNodes->pArray,(ulong)(uVar1 * 8));
    }
    vNodes->pArray = ppvVar7;
    uVar9 = uVar1;
    goto LAB_008554a1;
  }
  if ((int)uVar6 <= (int)uVar10) {
    uVar8 = (ulong)(int)uVar6;
    do {
      vNodes->pArray[uVar8] = (void *)0x0;
      uVar8 = uVar8 + 1;
    } while (uVar1 != uVar8);
  }
  vNodes->nSize = uVar1;
  uVar10 = *(uint *)&pNode->field_0x14 >> 0xc;
  uVar6 = uVar1;
LAB_008554d0:
  if ((int)uVar6 <= (int)uVar10) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                  ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
  }
  pNode->field_6 = *(anon_union_8_4_617c9805_for_Abc_Obj_t__17 *)(vNodes->pArray + uVar10);
  if ((int)uVar10 < vNodes->nSize) {
    vNodes->pArray[uVar10] = pNode;
    return;
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                ,0x1a6,"void Vec_PtrWriteEntry(Vec_Ptr_t *, int, void *)");
}

Assistant:

void Abc_NtkDfsReverseNodes_rec( Abc_Obj_t * pNode, Vec_Ptr_t * vNodes )
{
    Abc_Obj_t * pFanout;
    int i;
    assert( !Abc_ObjIsNet(pNode) );
    // if this node is already visited, skip
    if ( Abc_NodeIsTravIdCurrent( pNode ) )
        return;
    // mark the node as visited
    Abc_NodeSetTravIdCurrent( pNode );
    // skip the CI
    if ( Abc_ObjIsCo(pNode) )
        return;
    assert( Abc_ObjIsNode( pNode ) );
    // visit the transitive fanin of the node
    pNode = Abc_ObjFanout0Ntk(pNode);
    Abc_ObjForEachFanout( pNode, pFanout, i )
        Abc_NtkDfsReverseNodes_rec( pFanout, vNodes );
    // add the node after the fanins have been added
//    Vec_PtrPush( vNodes, pNode );
    Vec_PtrFillExtra( vNodes, pNode->Level + 1, NULL );
    pNode->pCopy = (Abc_Obj_t *)Vec_PtrEntry( vNodes, pNode->Level );
    Vec_PtrWriteEntry( vNodes, pNode->Level, pNode );
}